

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFns.c
# Opt level: O0

newtRef NsSetContains(newtRefArg rcvr,newtRefArg array,newtRefArg item)

{
  _Bool _Var1;
  uint32_t uVar2;
  newtRef *pnVar3;
  newtRef nVar4;
  uint local_38;
  uint32_t i;
  uint32_t n;
  newtRef *slots;
  newtRefArg item_local;
  newtRefArg array_local;
  newtRefArg rcvr_local;
  
  _Var1 = NewtRefIsArray(array);
  if (_Var1) {
    pnVar3 = NewtRefToSlots(array);
    uVar2 = NewtLength(array);
    for (local_38 = 0; local_38 < uVar2; local_38 = local_38 + 1) {
      if (pnVar3[local_38] == item) {
        nVar4 = NewtMakeInteger((ulong)local_38);
        return nVar4;
      }
    }
    rcvr_local = 2;
  }
  else {
    rcvr_local = NewtThrow(-0xbd11,array);
  }
  return rcvr_local;
}

Assistant:

newtRef NsSetContains(newtRefArg rcvr, newtRefArg array, newtRefArg item) {
    if (!NewtRefIsArray(array)) {
        return NewtThrow(kNErrNotAnArray, array);
    }
    
    newtRef *	slots;
    uint32_t	n;
    uint32_t	i;
    
    slots = NewtRefToSlots(array);
    n = NewtLength(array);
    
    for (i = 0; i < n; i++)
    {
        if (slots[i] == item) {
            return NewtMakeInteger(i);
        }
    }
    
    return kNewtRefNIL;
}